

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventpoint_p.h
# Opt level: O0

void __thiscall
QEventPointPrivate::QEventPointPrivate(QEventPointPrivate *this,int id,QPointingDevice *device)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  
  QSharedData::QSharedData((QSharedData *)0x3459d4);
  *(undefined8 *)(in_RDI + 8) = in_RDX;
  QPointer<QWindow>::QPointer((QPointer<QWindow> *)0x3459ea);
  QPointer<QObject>::QPointer((QPointer<QObject> *)0x3459f7);
  QPointF::QPointF((QPointF *)(in_RDI + 0x30));
  QPointF::QPointF((QPointF *)(in_RDI + 0x40));
  QPointF::QPointF((QPointF *)(in_RDI + 0x50));
  QPointF::QPointF((QPointF *)(in_RDI + 0x60));
  QPointF::QPointF((QPointF *)(in_RDI + 0x70));
  QPointF::QPointF((QPointF *)(in_RDI + 0x80));
  *(undefined8 *)(in_RDI + 0x90) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  QSizeF::QSizeF((QSizeF *)(in_RDI + 0xa0),0.0,0.0);
  QVector2D::QVector2D((QVector2D *)(in_RDI + 0xb0));
  *(undefined8 *)(in_RDI + 0xb8) = 0;
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  *(undefined8 *)(in_RDI + 200) = 0;
  *(undefined8 *)(in_RDI + 0xd0) = 0xffffffffffffffff;
  *(undefined4 *)(in_RDI + 0xd8) = in_ESI;
  *(undefined1 *)(in_RDI + 0xdc) = 0;
  *(undefined1 *)(in_RDI + 0xdd) = 0;
  return;
}

Assistant:

QEventPointPrivate(int id, const QPointingDevice *device)
      : device(device), pointId(id) { }